

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int fits_shuffle_2bytes(char *heap,LONGLONG length,int *status)

{
  int extraout_EAX;
  void *__src;
  long lVar1;
  
  __src = malloc(length * 2);
  if (0 < length) {
    lVar1 = 0;
    do {
      *(char *)((long)__src + lVar1) = heap[lVar1 * 2];
      *(char *)((long)__src + lVar1 + length) = heap[lVar1 * 2 + 1];
      lVar1 = lVar1 + 1;
    } while (length != lVar1);
  }
  memcpy(heap,__src,length * 2);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_shuffle_2bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 2-byte integers in the heap */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 2));
    heapptr = heap;
    cptr = ptr;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       cptr++;
    }
         
    memcpy(heap, ptr, (size_t) (length * 2));
    free(ptr);
    return(*status);
}